

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O2

bool sfi::logic::validateAddr(string *addr)

{
  long lVar1;
  istream *piVar2;
  unsigned_long uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  exception e;
  vector<int,_std::allocator<int>_> octets;
  string oct;
  istringstream ss;
  
  if (addr->_M_string_length < 0x10) {
    octets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    octets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    octets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)addr,_S_in);
    oct._M_dataplus._M_p = (pointer)&oct.field_2;
    oct._M_string_length = 0;
    oct.field_2._M_local_buf[0] = '\0';
    while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&ss,(string *)&oct,'.'),
          ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
      uVar3 = std::__cxx11::stoul(&oct,(size_t *)0x0,10);
      _e = (undefined4)uVar3;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&octets,(int *)&e);
    }
    uVar4 = (long)octets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)octets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (((uVar4 < 4) ||
        (*octets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start - 0x100U < 0xffffff01)) ||
       (0xfe < octets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar4 - 1])) {
      bVar6 = false;
    }
    else {
      lVar5 = 0;
      do {
        bVar6 = uVar4 - 2 == lVar5;
        if (bVar6) break;
        lVar1 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while (octets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar1] < 0x100);
    }
    std::__cxx11::string::~string((string *)&oct);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&octets.super__Vector_base<int,_std::allocator<int>_>);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

static bool sfi::logic::validateAddr(const string& addr){
    if(addr.length() > 15)
        return false;
    vector<int>octets;
    istringstream ss(addr);
    string oct;
    while(getline(ss,oct,'.')){
        try {
            octets.push_back(stoul(oct));
        } catch (exception e) {
            return false;
        }
    }

    if(octets.size() < 4)
        return false;

    if(octets[0] > 255 || octets[0] < 1)
        return false;

    if(octets[octets.size()-1] > 254)
        return false;

    for(int i = 1 ; i < octets.size()-1 ; i++){
        if(octets[i] > 255)
            return false;
    }
    return true;
}